

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

void __thiscall
gl4cts::EnhancedLayouts::VaryingComponentsTest::testInit(VaryingComponentsTest *this)

{
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  *this_00;
  testCase local_18;
  
  this_00 = &this->m_test_cases;
  local_18.m_layout = GVEC4;
  local_18.m_type = Double;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  local_18 = (testCase)&DAT_100000001;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  local_18.m_layout = GVEC3_SCALAR;
  local_18.m_type = Double;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  local_18.m_layout = GVEC2_GVEC2;
  local_18.m_type = Double;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  local_18.m_layout = GVEC2_SCALAR_SCALAR;
  local_18.m_type = Double;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  local_18 = (testCase)&DAT_100000005;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  local_18.m_layout = SCALAR_SCALAR_GVEC2;
  local_18.m_type = Double;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  local_18.m_layout = SCALAR_SCALAR_SCALAR_SCALAR;
  local_18.m_type = Double;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  local_18.m_layout = GVEC4;
  local_18.m_type = Float;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  local_18.m_layout = SCALAR_GVEC3;
  local_18.m_type = Float;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  local_18.m_layout = GVEC3_SCALAR;
  local_18.m_type = Float;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  local_18.m_layout = GVEC2_GVEC2;
  local_18.m_type = Float;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  local_18.m_layout = GVEC2_SCALAR_SCALAR;
  local_18.m_type = Float;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  local_18.m_layout = SCALAR_GVEC2_SCALAR;
  local_18.m_type = Float;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  local_18.m_layout = SCALAR_SCALAR_GVEC2;
  local_18.m_type = Float;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  local_18.m_layout = SCALAR_SCALAR_SCALAR_SCALAR;
  local_18.m_type = Float;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  local_18.m_layout = GVEC4;
  local_18.m_type = Int;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  local_18.m_layout = SCALAR_GVEC3;
  local_18.m_type = Int;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  local_18.m_layout = GVEC3_SCALAR;
  local_18.m_type = Int;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  local_18.m_layout = GVEC2_GVEC2;
  local_18.m_type = Int;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  local_18.m_layout = GVEC2_SCALAR_SCALAR;
  local_18.m_type = Int;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  local_18.m_layout = SCALAR_GVEC2_SCALAR;
  local_18.m_type = Int;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  local_18.m_layout = SCALAR_SCALAR_GVEC2;
  local_18.m_type = Int;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  local_18.m_layout = SCALAR_SCALAR_SCALAR_SCALAR;
  local_18.m_type = Int;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  local_18.m_layout = GVEC4;
  local_18.m_type = Uint;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  local_18.m_layout = SCALAR_GVEC3;
  local_18.m_type = Uint;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  local_18.m_layout = GVEC3_SCALAR;
  local_18.m_type = Uint;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  local_18.m_layout = GVEC2_GVEC2;
  local_18.m_type = Uint;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  local_18.m_layout = GVEC2_SCALAR_SCALAR;
  local_18.m_type = Uint;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  local_18.m_layout = SCALAR_GVEC2_SCALAR;
  local_18.m_type = Uint;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  local_18.m_layout = SCALAR_SCALAR_GVEC2;
  local_18.m_type = Uint;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  local_18.m_layout = SCALAR_SCALAR_SCALAR_SCALAR;
  local_18.m_type = Uint;
  std::
  vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::emplace_back<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>(this_00,&local_18);
  return;
}

Assistant:

void VaryingComponentsTest::testInit()
{
	m_test_cases.push_back(testCase(GVEC4, Utils::Type::Double));
	m_test_cases.push_back(testCase(SCALAR_GVEC3, Utils::Type::Double));
	m_test_cases.push_back(testCase(GVEC3_SCALAR, Utils::Type::Double));
	m_test_cases.push_back(testCase(GVEC2_GVEC2, Utils::Type::Double));
	m_test_cases.push_back(testCase(GVEC2_SCALAR_SCALAR, Utils::Type::Double));
	m_test_cases.push_back(testCase(SCALAR_GVEC2_SCALAR, Utils::Type::Double));
	m_test_cases.push_back(testCase(SCALAR_SCALAR_GVEC2, Utils::Type::Double));
	m_test_cases.push_back(testCase(SCALAR_SCALAR_SCALAR_SCALAR, Utils::Type::Double));

	m_test_cases.push_back(testCase(GVEC4, Utils::Type::Float));
	m_test_cases.push_back(testCase(SCALAR_GVEC3, Utils::Type::Float));
	m_test_cases.push_back(testCase(GVEC3_SCALAR, Utils::Type::Float));
	m_test_cases.push_back(testCase(GVEC2_GVEC2, Utils::Type::Float));
	m_test_cases.push_back(testCase(GVEC2_SCALAR_SCALAR, Utils::Type::Float));
	m_test_cases.push_back(testCase(SCALAR_GVEC2_SCALAR, Utils::Type::Float));
	m_test_cases.push_back(testCase(SCALAR_SCALAR_GVEC2, Utils::Type::Float));
	m_test_cases.push_back(testCase(SCALAR_SCALAR_SCALAR_SCALAR, Utils::Type::Float));

	m_test_cases.push_back(testCase(GVEC4, Utils::Type::Int));
	m_test_cases.push_back(testCase(SCALAR_GVEC3, Utils::Type::Int));
	m_test_cases.push_back(testCase(GVEC3_SCALAR, Utils::Type::Int));
	m_test_cases.push_back(testCase(GVEC2_GVEC2, Utils::Type::Int));
	m_test_cases.push_back(testCase(GVEC2_SCALAR_SCALAR, Utils::Type::Int));
	m_test_cases.push_back(testCase(SCALAR_GVEC2_SCALAR, Utils::Type::Int));
	m_test_cases.push_back(testCase(SCALAR_SCALAR_GVEC2, Utils::Type::Int));
	m_test_cases.push_back(testCase(SCALAR_SCALAR_SCALAR_SCALAR, Utils::Type::Int));

	m_test_cases.push_back(testCase(GVEC4, Utils::Type::Uint));
	m_test_cases.push_back(testCase(SCALAR_GVEC3, Utils::Type::Uint));
	m_test_cases.push_back(testCase(GVEC3_SCALAR, Utils::Type::Uint));
	m_test_cases.push_back(testCase(GVEC2_GVEC2, Utils::Type::Uint));
	m_test_cases.push_back(testCase(GVEC2_SCALAR_SCALAR, Utils::Type::Uint));
	m_test_cases.push_back(testCase(SCALAR_GVEC2_SCALAR, Utils::Type::Uint));
	m_test_cases.push_back(testCase(SCALAR_SCALAR_GVEC2, Utils::Type::Uint));
	m_test_cases.push_back(testCase(SCALAR_SCALAR_SCALAR_SCALAR, Utils::Type::Uint));
}